

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

void __thiscall
QSequentialAnimationGroupPrivate::setCurrentAnimation
          (QSequentialAnimationGroupPrivate *this,int index,bool intermediate)

{
  QSequentialAnimationGroupPrivate *_t1;
  qsizetype qVar1;
  Promoted<int,_long_long> PVar2;
  const_reference ppQVar3;
  QList<QAbstractAnimation_*> *pQVar4;
  parameter_type pQVar5;
  QSequentialAnimationGroupPrivate *in_RDI;
  long in_FS_OFFSET;
  QSequentialAnimationGroup *q;
  parameter_type in_stack_ffffffffffffffb8;
  QList<QAbstractAnimation_*> *in_stack_ffffffffffffffc0;
  undefined1 intermediate_00;
  QSequentialAnimationGroupPrivate *this_00;
  long local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _t1 = (QSequentialAnimationGroupPrivate *)q_func(in_RDI);
  qVar1 = QList<QAbstractAnimation_*>::size(&(in_RDI->super_QAnimationGroupPrivate).animations);
  local_18 = qVar1 + -1;
  PVar2 = qMin<int,long_long>(&local_c,&local_18);
  local_c = (int)PVar2;
  if (local_c == -1) {
    in_RDI->currentAnimationIndex = -1;
    QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
    ::operator=((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                 *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    if (local_c == in_RDI->currentAnimationIndex) {
      ppQVar3 = QList<QAbstractAnimation_*>::at
                          (in_stack_ffffffffffffffc0,(qsizetype)in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffc0 = (QList<QAbstractAnimation_*> *)*ppQVar3;
      pQVar4 = (QList<QAbstractAnimation_*> *)
               QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
                         ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                           *)0x68a1c3);
      if (in_stack_ffffffffffffffc0 == pQVar4) goto LAB_0068a272;
    }
    pQVar5 = QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
                       ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                         *)0x68a1e6);
    if (pQVar5 != (parameter_type)0x0) {
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::operator->((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                    *)in_stack_ffffffffffffffc0);
      QAbstractAnimation::stop((QAbstractAnimation *)in_stack_ffffffffffffffc0);
    }
    in_RDI->currentAnimationIndex = local_c;
    QList<QAbstractAnimation_*>::at(in_stack_ffffffffffffffc0,(qsizetype)in_stack_ffffffffffffffb8);
    intermediate_00 = (undefined1)((ulong)in_RDI >> 0x38);
    QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
    ::operator=((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                 *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    this_00 = _t1;
    QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
              ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                *)0x68a253);
    QSequentialAnimationGroup::currentAnimationChanged
              ((QSequentialAnimationGroup *)0x68a25f,(QAbstractAnimation *)_t1);
    activateCurrentAnimation(this_00,(bool)intermediate_00);
  }
LAB_0068a272:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::setCurrentAnimation(int index, bool intermediate)
{
    Q_Q(QSequentialAnimationGroup);
    // currentAnimation.removeBindingUnlessInWrapper()
    // is not necessary here, since it is read only

    index = qMin(index, animations.size() - 1);

    if (index == -1) {
        Q_ASSERT(animations.isEmpty());
        currentAnimationIndex = -1;
        currentAnimation = nullptr;
        return;
    }

    // need these two checks below because this func can be called after the current animation
    // has been removed
    if (index == currentAnimationIndex && animations.at(index) == currentAnimation)
        return;

    // stop the old current animation
    if (currentAnimation)
        currentAnimation->stop();

    currentAnimationIndex = index;
    currentAnimation = animations.at(index);

    emit q->currentAnimationChanged(currentAnimation);

    activateCurrentAnimation(intermediate);
}